

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRBlock * __thiscall
diligent_spirv_cross::Compiler::maybe_get<diligent_spirv_cross::SPIRBlock>
          (Compiler *this,uint32_t id)

{
  SPIRBlock *pSVar1;
  
  if (((ulong)id < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr[id].type == TypeBlock)) {
    pSVar1 = Variant::get<diligent_spirv_cross::SPIRBlock>
                       ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id);
    return pSVar1;
  }
  return (SPIRBlock *)0x0;
}

Assistant:

const T *maybe_get(uint32_t id) const
	{
		if (id >= ir.ids.size())
			return nullptr;
		else if (ir.ids[id].get_type() == static_cast<Types>(T::type))
			return &get<T>(id);
		else
			return nullptr;
	}